

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::LabelTests_PrintHieroReorder_Test::~LabelTests_PrintHieroReorder_Test
          (LabelTests_PrintHieroReorder_Test *this)

{
  LabelTests_PrintHieroReorder_Test *this_local;
  
  ~LabelTests_PrintHieroReorder_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LabelTests, PrintHieroReorder) {
  auto asp = readAlignedSentencePair<false, false>("a c\tb d\t0-0");
  std::ostringstream s;
  PhrasalRule rule{asp};
  rule.nts[0] = NT({{0, 1}, {1, 2}}, "X");
  rule.nts[1] = NT({{1, 2}, {0, 1}}, "X");
  auto nt = rule.nts[0].span;
  nt = rule.nts[1].span;
  s << rule;
  EXPECT_EQ("[X]\t[X,1] [X,2]\t[X,2] [X,1]\t", s.str());
}